

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::to_ternary_expression_abi_cxx11_
          (CompilerGLSL *this,SPIRType *restype,uint32_t select,uint32_t true_value,
          uint32_t false_value)

{
  undefined4 in_register_00000014;
  uint32_t id;
  uint32_t in_R9D;
  __0 local_158 [32];
  __0 local_138 [32];
  __0 local_118 [36];
  uint local_f4;
  undefined1 local_f0 [4];
  uint32_t i;
  SPIRType *local_d0;
  anon_class_8_1_8991fb9c swiz;
  undefined1 local_a8 [32];
  undefined1 local_88 [80];
  SPIRType *local_38;
  SPIRType *lerptype;
  uint32_t local_28;
  uint32_t false_value_local;
  uint32_t true_value_local;
  uint32_t select_local;
  SPIRType *restype_local;
  CompilerGLSL *this_local;
  string *expr;
  
  _true_value_local = CONCAT44(in_register_00000014,select);
  lerptype._3_1_ = 0;
  lerptype._4_4_ = in_R9D;
  local_28 = false_value;
  false_value_local = true_value;
  restype_local = restype;
  this_local = this;
  ::std::__cxx11::string::string((string *)this);
  local_38 = Compiler::expression_type((Compiler *)restype,false_value_local);
  if (local_38->vecsize == 1) {
    id = (uint32_t)restype;
    to_enclosed_expression_abi_cxx11_((CompilerGLSL *)local_88,id,SUB41(false_value_local,0));
    to_enclosed_pointer_expression_abi_cxx11_((CompilerGLSL *)local_a8,id,SUB41(local_28,0));
    to_enclosed_pointer_expression_abi_cxx11_((CompilerGLSL *)&swiz,id,(bool)lerptype._4_1_);
    join<std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[4],std::__cxx11::string>
              ((spirv_cross *)(local_88 + 0x20),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
               (char (*) [4])0x5c05c3,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
               (char (*) [4])0x5bb13b,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&swiz);
    ::std::__cxx11::string::operator=((string *)this,(string *)(local_88 + 0x20));
    ::std::__cxx11::string::~string((string *)(local_88 + 0x20));
    ::std::__cxx11::string::~string((string *)&swiz);
    ::std::__cxx11::string::~string((string *)local_a8);
    ::std::__cxx11::string::~string((string *)local_88);
  }
  else {
    local_d0 = restype;
    type_to_glsl_constructor_abi_cxx11_((CompilerGLSL *)local_f0,restype);
    ::std::__cxx11::string::operator=((string *)this,(string *)local_f0);
    ::std::__cxx11::string::~string((string *)local_f0);
    ::std::__cxx11::string::operator+=((string *)this,"(");
    for (local_f4 = 0; local_f4 < *(uint *)(_true_value_local + 0x14); local_f4 = local_f4 + 1) {
      to_ternary_expression[abi:cxx11](spirv_cross::SPIRType_const&,unsigned_int,unsigned_int,unsigned_int)
      ::$_0::operator()[abi_cxx11_(local_118,(uint32_t)&local_d0,false_value_local);
      ::std::__cxx11::string::operator+=((string *)this,(string *)local_118);
      ::std::__cxx11::string::~string((string *)local_118);
      ::std::__cxx11::string::operator+=((string *)this," ? ");
      to_ternary_expression[abi:cxx11](spirv_cross::SPIRType_const&,unsigned_int,unsigned_int,unsigned_int)
      ::$_0::operator()[abi_cxx11_(local_138,(uint32_t)&local_d0,local_28);
      ::std::__cxx11::string::operator+=((string *)this,(string *)local_138);
      ::std::__cxx11::string::~string((string *)local_138);
      ::std::__cxx11::string::operator+=((string *)this," : ");
      to_ternary_expression[abi:cxx11](spirv_cross::SPIRType_const&,unsigned_int,unsigned_int,unsigned_int)
      ::$_0::operator()[abi_cxx11_(local_158,(uint32_t)&local_d0,lerptype._4_4_);
      ::std::__cxx11::string::operator+=((string *)this,(string *)local_158);
      ::std::__cxx11::string::~string((string *)local_158);
      if (local_f4 + 1 < *(uint *)(_true_value_local + 0x14)) {
        ::std::__cxx11::string::operator+=((string *)this,", ");
      }
    }
    ::std::__cxx11::string::operator+=((string *)this,")");
  }
  return this;
}

Assistant:

string CompilerGLSL::to_ternary_expression(const SPIRType &restype, uint32_t select, uint32_t true_value,
                                           uint32_t false_value)
{
	string expr;
	auto &lerptype = expression_type(select);

	if (lerptype.vecsize == 1)
		expr = join(to_enclosed_expression(select), " ? ", to_enclosed_pointer_expression(true_value), " : ",
		            to_enclosed_pointer_expression(false_value));
	else
	{
		auto swiz = [this](uint32_t expression, uint32_t i) { return to_extract_component_expression(expression, i); };

		expr = type_to_glsl_constructor(restype);
		expr += "(";
		for (uint32_t i = 0; i < restype.vecsize; i++)
		{
			expr += swiz(select, i);
			expr += " ? ";
			expr += swiz(true_value, i);
			expr += " : ";
			expr += swiz(false_value, i);
			if (i + 1 < restype.vecsize)
				expr += ", ";
		}
		expr += ")";
	}

	return expr;
}